

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O1

ClockingSkew __thiscall
slang::ast::ClockingSkew::fromSyntax
          (ClockingSkew *this,ClockingSkewSyntax *syntax,ASTContext *context)

{
  short sVar1;
  int iVar2;
  undefined4 extraout_var;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *value;
  undefined8 uVar4;
  ClockingSkew CVar5;
  ConstantValue cv;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  _Stack_48;
  TimingControl *pTVar3;
  
  sVar1 = *(short *)&this[1].delay;
  if (sVar1 == 0x8c) {
    uVar4 = 3;
  }
  else if (sVar1 == 0xdb) {
    uVar4 = 2;
  }
  else if (sVar1 == 0xec) {
    uVar4 = 1;
  }
  else {
    uVar4 = 0;
  }
  if (this[2].delay == (TimingControl *)0x0) {
    pTVar3 = (TimingControl *)0x0;
  }
  else {
    iVar2 = TimingControl::bind((int)this[2].delay,(sockaddr *)syntax,(socklen_t)context);
    pTVar3 = (TimingControl *)CONCAT44(extraout_var,iVar2);
    if (pTVar3->kind == Delay) {
      ASTContext::eval((ConstantValue *)&_Stack_48,(ASTContext *)syntax,*(Expression **)(pTVar3 + 1)
                       ,(bitmask<slang::ast::EvalFlags>)0x0);
      if (_Stack_48._M_index == '\x01') {
        value = std::
                get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                          ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            *)&_Stack_48);
        ASTContext::requirePositive((ASTContext *)syntax,value,pTVar3->sourceRange);
      }
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage(&_Stack_48);
    }
  }
  CVar5.delay = pTVar3;
  CVar5._0_8_ = uVar4;
  return CVar5;
}

Assistant:

ClockingSkew ClockingSkew::fromSyntax(const ClockingSkewSyntax& syntax, const ASTContext& context) {
    ClockingSkew result;
    result.edge = SemanticFacts::getEdgeKind(syntax.edge.kind);

    if (syntax.delay) {
        result.delay = &TimingControl::bind(*syntax.delay, context);
        if (result.delay->kind == TimingControlKind::Delay) {
            auto cv = context.eval(result.delay->as<DelayControl>().expr);
            if (cv.isInteger())
                context.requirePositive(cv.integer(), result.delay->sourceRange);
        }
    }

    return result;
}